

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O0

void __thiscall
tst_deprecations_helpers_qpromiseall::emptySequence(tst_deprecations_helpers_qpromiseall *this)

{
  bool bVar1;
  QList<int> local_a8;
  QList<int> local_88;
  QList<int> local_68;
  undefined4 local_4c;
  bool local_46;
  bool local_45 [13];
  QList<QtPromise::QPromise<int>_> local_38;
  undefined1 local_20 [8];
  QPromise<QList<int>_> p;
  tst_deprecations_helpers_qpromiseall *this_local;
  
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (QPromise<int> *)0x0;
  local_38.d.size = 0;
  p.super_QPromiseBase<QList<int>_>.m_d.d = (PromiseData<QList<int>_> *)this;
  QList<QtPromise::QPromise<int>_>::QList(&local_38);
  QtPromise::qPromiseAll<QList<QtPromise::QPromise<int>>>((QtPromise *)local_20,&local_38);
  QList<QtPromise::QPromise<int>_>::~QList(&local_38);
  local_45[0] = QtPromise::QPromiseBase<QList<int>_>::isFulfilled
                          ((QPromiseBase<QList<int>_> *)local_20);
  local_46 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (local_45,&local_46,"p.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x53);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (int *)0x0;
    local_88.d.size = 0;
    QList<int>::QList(&local_88);
    waitForValue<QList<int>>(&local_68,(QPromise<QList<int>_> *)local_20,&local_88);
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (int *)0x0;
    local_a8.d.size = 0;
    QList<int>::QList(&local_a8);
    bVar1 = QTest::qCompare<int>
                      (&local_68,&local_a8,"waitForValue(p, QVector<int>{})","QVector<int>{}",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x54);
    QList<int>::~QList(&local_a8);
    QList<int>::~QList(&local_68);
    QList<int>::~QList(&local_88);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_4c = 0;
    }
    else {
      local_4c = 1;
    }
  }
  else {
    local_4c = 1;
  }
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_20);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::emptySequence()
{
    auto p = qPromiseAll(QVector<QtPromise::QPromise<int>>());

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(waitForValue(p, QVector<int>{}), QVector<int>{});
}